

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

GdlExpression * __thiscall
GdlBinaryExpression::SimplifyAndUnscale
          (GdlBinaryExpression *this,GrcGlyphAttrMatrix *pgax,gid16 wGlyphID,SymbolSet *setpsym,
          GrcFont *pfont,bool fGAttrDefChk,bool *pfCanSub)

{
  long lVar1;
  ulong uVar2;
  GdlNumericExpression *this_00;
  undefined8 in_RCX;
  undefined2 in_DX;
  undefined8 in_RSI;
  GdlNumericExpression *in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  undefined8 in_stack_00000008;
  GdlExpression *pexpRet;
  int nValue;
  GdlBinaryExpression *pexpbinRet;
  GdlExpression *pexpOperand2New;
  GdlExpression *pexpOperand1New;
  bool fCanSubOperand2;
  bool fCanSubOperand1;
  GdlObject *gdl;
  undefined8 in_stack_ffffffffffffff58;
  long *plVar3;
  int nValue_00;
  GdlNumericExpression *in_stack_ffffffffffffff60;
  GdlNumericExpression *local_88;
  undefined1 local_54 [4];
  GdlNumericExpression *local_50;
  long local_48;
  long local_40;
  GdlObject local_33;
  GdlNumericExpression *local_8;
  
  nValue_00 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_33.m_lnf.m_nLinePre._2_1_ = in_R9B & 1;
  local_33.m_lnf._3_8_ = in_R8;
  local_33.m_lnf._11_8_ = in_RCX;
  local_33.m_lnf._25_2_ = in_DX;
  local_33.m_lnf._27_8_ = in_RSI;
  local_40 = (**(code **)(**(long **)(in_RDI + 1) + 0x78))
                       (*(long **)(in_RDI + 1),in_RSI,in_DX,in_RCX,in_R8,
                        local_33.m_lnf.m_nLinePre._2_1_,
                        (undefined1 *)((long)&local_33.m_lnf.m_nLinePre + 1));
  gdl = &local_33;
  local_48 = (**(code **)(**(long **)&in_RDI[1].field_0x8 + 0x78))
                       (*(long **)&in_RDI[1].field_0x8,local_33.m_lnf._27_8_,local_33.m_lnf._25_2_,
                        local_33.m_lnf._11_8_,local_33.m_lnf._3_8_,
                        local_33.m_lnf.m_nLinePre._2_1_ & 1);
  if ((local_40 == 0) || (local_48 == 0)) {
    local_8 = (GdlNumericExpression *)0x0;
  }
  else {
    local_50 = in_RDI;
    if ((local_40 != 0) && (local_40 != *(long *)(in_RDI + 1))) {
      if ((local_33.m_lnf.m_nLinePre._1_1_ & 1) == 0) {
        lVar1 = (*(code *)**(undefined8 **)in_RDI)();
        if (lVar1 == 0) {
          local_88 = (GdlNumericExpression *)0x0;
        }
        else {
          local_88 = (GdlNumericExpression *)
                     __dynamic_cast(lVar1,&GdlExpression::typeinfo,&typeinfo,0);
        }
        local_50 = local_88;
      }
      if (*(long **)(local_50 + 1) != (long *)0x0) {
        (**(code **)(**(long **)(local_50 + 1) + 0x10))();
      }
      *(long *)(local_50 + 1) = local_40;
    }
    if ((local_48 != 0) && (local_48 != *(long *)&in_RDI[1].field_0x8)) {
      if ((((byte)local_33.m_lnf.m_nLinePre & 1) == 0) && (local_50 == in_RDI)) {
        lVar1 = (*(code *)**(undefined8 **)in_RDI)();
        if (lVar1 == 0) {
          in_stack_ffffffffffffff60 = (GdlNumericExpression *)0x0;
          local_50 = in_stack_ffffffffffffff60;
        }
        else {
          in_stack_ffffffffffffff60 =
               (GdlNumericExpression *)__dynamic_cast(lVar1,&GdlExpression::typeinfo,&typeinfo,0);
          local_50 = in_stack_ffffffffffffff60;
        }
      }
      plVar3 = *(long **)&local_50[1].field_0x8;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x10))();
      }
      nValue_00 = (int)((ulong)plVar3 >> 0x20);
      *(long *)&local_50[1].field_0x8 = local_48;
    }
    *(bool *)in_stack_00000008 = local_50 == in_RDI;
    uVar2 = (**(code **)(*(long *)in_RDI + 0x38))(in_RDI,local_54,0);
    if ((uVar2 & 1) == 0) {
      local_8 = local_50;
    }
    else {
      this_00 = (GdlNumericExpression *)operator_new(0x40);
      GdlNumericExpression::GdlNumericExpression(in_stack_ffffffffffffff60,nValue_00);
      GdlObject::CopyLineAndFile((GdlObject *)this_00,gdl);
      local_8 = this_00;
    }
  }
  return (GdlExpression *)local_8;
}

Assistant:

GdlExpression * GdlBinaryExpression::SimplifyAndUnscale(GrcGlyphAttrMatrix * pgax,
	gid16 wGlyphID, SymbolSet & setpsym, GrcFont * pfont, bool fGAttrDefChk,
	bool * pfCanSub)
{
	bool fCanSubOperand1, fCanSubOperand2;
	GdlExpression * pexpOperand1New =
		m_pexpOperand1->SimplifyAndUnscale(pgax, wGlyphID, setpsym, pfont,
			fGAttrDefChk, &fCanSubOperand1);
	GdlExpression * pexpOperand2New =
		m_pexpOperand2->SimplifyAndUnscale(pgax, wGlyphID, setpsym, pfont,
			fGAttrDefChk, &fCanSubOperand2);

	if (!pexpOperand1New || !pexpOperand2New)
		return NULL;

	GdlBinaryExpression * pexpbinRet = this;

	if (pexpOperand1New && pexpOperand1New != m_pexpOperand1)
	{
		if (!fCanSubOperand1)
		{
			pexpbinRet = dynamic_cast<GdlBinaryExpression *>(this->Clone());
			Assert(pexpbinRet);
		}
		delete pexpbinRet->m_pexpOperand1;
		pexpbinRet->m_pexpOperand1 = pexpOperand1New;
	}
	if (pexpOperand2New && pexpOperand2New != m_pexpOperand2)
	{
		if (!fCanSubOperand2 && pexpbinRet == this)
		{
			pexpbinRet = dynamic_cast<GdlBinaryExpression *>(this->Clone());
			Assert(pexpbinRet);
		}
		delete pexpbinRet->m_pexpOperand2;
		pexpbinRet->m_pexpOperand2 = pexpOperand2New;
	}
	*pfCanSub = (pexpbinRet == this);

	int nValue;
	if (this->ResolveToInteger(&nValue, false))
	{
		GdlExpression * pexpRet = new GdlNumericExpression(nValue);
		pexpRet->CopyLineAndFile(*this);
		return pexpRet;
	}

	return pexpbinRet;
}